

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

CollSeq * sqlite3ExprCollSeq(Parse *pParse,Expr *pExpr)

{
  byte bVar1;
  uint uVar2;
  sqlite3 *db;
  ExprList *pEVar3;
  bool bVar4;
  CollSeq *pColl;
  CollSeq *pCVar5;
  Expr *pEVar6;
  uint uVar7;
  long lVar8;
  
  db = pParse->db;
  pColl = (CollSeq *)0x0;
  do {
    if (pExpr == (Expr *)0x0) break;
    uVar2 = pExpr->flags;
    bVar4 = true;
    if ((uVar2 >> 9 & 1) == 0) {
      bVar1 = pExpr->op;
      if (bVar1 < 0x98) {
        if (bVar1 != 0x35) {
          if (bVar1 == 0x42) goto switchD_001554e6_caseD_4;
LAB_00155517:
          if (bVar1 == 0x58) goto switchD_001554e6_caseD_0;
          goto switchD_001554e6_caseD_1;
        }
LAB_001555b9:
        pColl = sqlite3GetCollSeq(pParse,db->enc,(CollSeq *)0x0,(pExpr->u).zToken);
        goto LAB_001555d7;
      }
      uVar7 = bVar1 - 0x98;
      switch(uVar7) {
      case 0:
      case 2:
        goto switchD_001554e6_caseD_0;
      default:
        goto switchD_001554e6_caseD_1;
      case 4:
switchD_001554e6_caseD_4:
        pExpr = pExpr->pLeft;
LAB_001555b5:
        bVar4 = false;
        break;
      case 5:
        if (pExpr->op2 == '5') goto LAB_001555b9;
        if ((5 < uVar7) || ((0x25U >> (uVar7 & 0x1f) & 1) == 0)) goto LAB_00155517;
switchD_001554e6_caseD_0:
        if (pExpr->pTab == (Table *)0x0) {
switchD_001554e6_caseD_1:
          if ((uVar2 >> 8 & 1) != 0) {
            pEVar6 = pExpr->pLeft;
            if ((pEVar6 == (Expr *)0x0) || ((pEVar6->flags & 0x100) == 0)) {
              pEVar6 = pExpr->pRight;
              pEVar3 = (pExpr->x).pList;
              if (((uVar2 >> 0xb & 1) == 0 && pEVar3 != (ExprList *)0x0) &&
                 (0 < (long)pEVar3->nExpr)) {
                lVar8 = 0;
                do {
                  pExpr = *(Expr **)((long)&pEVar3->a->pExpr + lVar8);
                  if ((pExpr->flags & 0x100) != 0) goto LAB_001555b5;
                  lVar8 = lVar8 + 0x20;
                } while ((long)pEVar3->nExpr * 0x20 != lVar8);
              }
            }
            bVar4 = false;
            pExpr = pEVar6;
          }
        }
        else if (-1 < (long)pExpr->iColumn) {
          pColl = sqlite3FindCollSeq(db,db->enc,pExpr->pTab->aCol[pExpr->iColumn].zColl,0);
        }
      }
    }
LAB_001555d7:
  } while (!bVar4);
  if ((pColl != (CollSeq *)0x0) &&
     (pCVar5 = sqlite3GetCollSeq(pParse,pParse->db->enc,pColl,pColl->zName),
     pCVar5 == (CollSeq *)0x0)) {
    pColl = (CollSeq *)0x0;
  }
  return pColl;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3ExprCollSeq(Parse *pParse, Expr *pExpr){
  sqlite3 *db = pParse->db;
  CollSeq *pColl = 0;
  Expr *p = pExpr;
  while( p ){
    int op = p->op;
    if( p->flags & EP_Generic ) break;
    if( op==TK_CAST || op==TK_UPLUS ){
      p = p->pLeft;
      continue;
    }
    if( op==TK_COLLATE || (op==TK_REGISTER && p->op2==TK_COLLATE) ){
      pColl = sqlite3GetCollSeq(pParse, ENC(db), 0, p->u.zToken);
      break;
    }
    if( (op==TK_AGG_COLUMN || op==TK_COLUMN
          || op==TK_REGISTER || op==TK_TRIGGER)
     && p->pTab!=0
    ){
      /* op==TK_REGISTER && p->pTab!=0 happens when pExpr was originally
      ** a TK_COLUMN but was previously evaluated and cached in a register */
      int j = p->iColumn;
      if( j>=0 ){
        const char *zColl = p->pTab->aCol[j].zColl;
        pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
      }
      break;
    }
    if( p->flags & EP_Collate ){
      if( p->pLeft && (p->pLeft->flags & EP_Collate)!=0 ){
        p = p->pLeft;
      }else{
        Expr *pNext  = p->pRight;
        /* The Expr.x union is never used at the same time as Expr.pRight */
        assert( p->x.pList==0 || p->pRight==0 );
        /* p->flags holds EP_Collate and p->pLeft->flags does not.  And
        ** p->x.pSelect cannot.  So if p->x.pLeft exists, it must hold at
        ** least one EP_Collate. Thus the following two ALWAYS. */
        if( p->x.pList!=0 && ALWAYS(!ExprHasProperty(p, EP_xIsSelect)) ){
          int i;
          for(i=0; ALWAYS(i<p->x.pList->nExpr); i++){
            if( ExprHasProperty(p->x.pList->a[i].pExpr, EP_Collate) ){
              pNext = p->x.pList->a[i].pExpr;
              break;
            }
          }
        }
        p = pNext;
      }
    }else{
      break;
    }
  }
  if( sqlite3CheckCollSeq(pParse, pColl) ){ 
    pColl = 0;
  }
  return pColl;
}